

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gena_device.c
# Opt level: O2

int genaNotifyAllCommon(UpnpDevice_Handle device_handle,char *UDN,char *servId,char *propertySet)

{
  LinkedList *list;
  void *input;
  Upnp_Handle_Type UVar1;
  uint uVar2;
  int *__ptr;
  char *__ptr_00;
  char *__ptr_01;
  service_info *service;
  subscription *current;
  undefined8 *__ptr_02;
  time_t tVar3;
  long lVar4;
  ListNode *pLVar5;
  ThreadPoolJob *job;
  int DbgLineNo;
  Handle_Info **HndInfo;
  int line;
  char *local_58;
  Handle_Info *handle_info;
  
  line = 2;
  UpnpPrintf(UPNP_INFO,GENA,".upnp/src/gena/gena_device.c",0x337,"GENA BEGIN NOTIFY ALL COMMON\n");
  __ptr = (int *)malloc(4);
  if (__ptr == (int *)0x0) {
    DbgLineNo = 0x33d;
    uVar2 = 0xffffff98;
    goto LAB_00120dbd;
  }
  *__ptr = 0;
  __ptr_00 = strdup(UDN);
  if (__ptr_00 == (char *)0x0) {
    uVar2 = 0xffffff98;
    DbgLineNo = 0x345;
    local_58 = (char *)0x0;
    __ptr_01 = (char *)0x0;
  }
  else {
    local_58 = strdup(servId);
    uVar2 = 0xffffff98;
    if (local_58 == (char *)0x0) {
      DbgLineNo = 0x34c;
LAB_00120d40:
      __ptr_01 = (char *)0x0;
    }
    else {
      __ptr_01 = AllocGenaHeaders(propertySet);
      if (__ptr_01 == (char *)0x0) {
        DbgLineNo = 0x353;
        goto LAB_00120d40;
      }
      HandleLock((char *)0x358,line);
      HndInfo = &handle_info;
      UVar1 = GetHandleInfo(device_handle,HndInfo);
      line = (int)HndInfo;
      if (UVar1 == HND_DEVICE) {
        service = FindServiceId(&handle_info->ServiceTable,servId,UDN);
        line = (int)servId;
        if (service == (service_info *)0x0) {
          DbgLineNo = 0x3a3;
          uVar2 = 0xffffff91;
        }
        else {
          current = GetFirstSubscription(service);
          while( true ) {
            line = (int)servId;
            DbgLineNo = 0;
            if (current == (subscription *)0x0) break;
            __ptr_02 = (undefined8 *)malloc(0x68);
            if (__ptr_02 == (undefined8 *)0x0) {
              DbgLineNo = 0x369;
LAB_00120d82:
              uVar2 = 0xffffff98;
              goto LAB_00120d8e;
            }
            *__ptr = *__ptr + 1;
            __ptr_02[0xb] = __ptr;
            __ptr_02[3] = __ptr_00;
            __ptr_02[2] = local_58;
            *__ptr_02 = __ptr_01;
            __ptr_02[1] = propertySet;
            strncpy((char *)(__ptr_02 + 4),current->sid,0x2c);
            *(undefined1 *)((long)__ptr_02 + 0x4b) = 0;
            tVar3 = time((time_t *)0x0);
            __ptr_02[10] = tVar3;
            *(UpnpDevice_Handle *)(__ptr_02 + 0xc) = device_handle;
            list = &current->outgoing;
            tVar3 = time((time_t *)0x0);
            while (lVar4 = ListSize(list), 1 < lVar4) {
              pLVar5 = ListHead(list);
              if ((pLVar5 == (ListNode *)0x0) || (pLVar5 = pLVar5->next, pLVar5 == (ListNode *)0x0))
              {
                fwrite("gena_device: maybeDiscardEvents: list is inconsistent\n",0x36,1,_stderr);
                break;
              }
              input = *(void **)((long)pLVar5->item + 8);
              lVar4 = ListSize(list);
              if ((lVar4 <= g_UpnpSdkEQMaxLen) &&
                 (tVar3 - *(long *)((long)input + 0x50) <= (long)g_UpnpSdkEQMaxAge)) break;
              free_notify_struct(input);
              free(pLVar5->item);
              ListDelNode(list,pLVar5,0);
            }
            line = 0x30;
            job = (ThreadPoolJob *)calloc(1,0x30);
            if (job == (ThreadPoolJob *)0x0) {
              free(__ptr_02);
              DbgLineNo = 0x380;
              goto LAB_00120d82;
            }
            TPJobInit(job,genaNotifyThread,__ptr_02);
            TPJobSetFreeFunction(job,free_notify_struct);
            TPJobSetPriority(job,MED_PRIORITY);
            pLVar5 = ListAddTail(list,job);
            lVar4 = ListSize(list);
            if (lVar4 == 1) {
              uVar2 = ThreadPoolAdd(&gSendThreadPool,job,(int *)0x0);
              line = (int)job;
              if (uVar2 != 0) {
                DbgLineNo = 0x396;
                if (uVar2 == 0x20000000) goto LAB_00120d82;
                DbgLineNo = 0x394;
                goto LAB_00120d8e;
              }
              if (pLVar5 != (ListNode *)0x0) {
                *(undefined4 *)((long)pLVar5->item + 0x2c) = 0x1fffffff;
              }
            }
            servId = current->sid;
            current = GetNextSubscription(service,current);
          }
          uVar2 = 0;
        }
      }
      else {
        DbgLineNo = 0x35b;
        uVar2 = 0xffffff9c;
      }
    }
LAB_00120d8e:
    if (*__ptr != 0) goto LAB_00120dbd;
  }
  free(__ptr_01);
  ixmlFreeDOMString(propertySet);
  free(local_58);
  free(__ptr_00);
  free(__ptr);
LAB_00120dbd:
  HandleUnlock((char *)0x3b5,line);
  UpnpPrintf(UPNP_INFO,GENA,".upnp/src/gena/gena_device.c",DbgLineNo,
             "GENA END NOTIFY ALL COMMON, ret = %d\n",(ulong)uVar2);
  return uVar2;
}

Assistant:

static int genaNotifyAllCommon(UpnpDevice_Handle device_handle,
	char *UDN,
	char *servId,
	DOMString propertySet)
{
	int ret = GENA_SUCCESS;
	int line = 0;

	int *reference_count = NULL;
	char *UDN_copy = NULL;
	char *servId_copy = NULL;
	char *headers = NULL;
	notify_thread_struct *thread_s = NULL;

	subscription *finger = NULL;
	service_info *service = NULL;
	struct Handle_Info *handle_info;

	UpnpPrintf(UPNP_INFO,
		GENA,
		__FILE__,
		__LINE__,
		"GENA BEGIN NOTIFY ALL COMMON\n");

	/* Keep this allocation first */
	reference_count = (int *)malloc(sizeof(int));
	if (reference_count == NULL) {
		line = __LINE__;
		ret = UPNP_E_OUTOF_MEMORY;
		goto ExitFunction;
	}
	*reference_count = 0;

	UDN_copy = strdup(UDN);
	if (UDN_copy == NULL) {
		line = __LINE__;
		ret = UPNP_E_OUTOF_MEMORY;
		goto ExitFunction;
	}

	servId_copy = strdup(servId);
	if (servId_copy == NULL) {
		line = __LINE__;
		ret = UPNP_E_OUTOF_MEMORY;
		goto ExitFunction;
	}

	headers = AllocGenaHeaders(propertySet);
	if (headers == NULL) {
		line = __LINE__;
		ret = UPNP_E_OUTOF_MEMORY;
		goto ExitFunction;
	}

	HandleLock(__FILE__, __LINE__);

	if (GetHandleInfo(device_handle, &handle_info) != HND_DEVICE) {
		line = __LINE__;
		ret = GENA_E_BAD_HANDLE;
	} else {
		service =
			FindServiceId(&handle_info->ServiceTable, servId, UDN);
		if (service != NULL) {
			finger = GetFirstSubscription(service);
			while (finger) {
				ThreadPoolJob *job = NULL;
				ListNode *node;

				thread_s = (notify_thread_struct *)malloc(
					sizeof(notify_thread_struct));
				if (thread_s == NULL) {
					line = __LINE__;
					ret = UPNP_E_OUTOF_MEMORY;
					break;
				}

				(*reference_count)++;
				thread_s->reference_count = reference_count;
				thread_s->UDN = UDN_copy;
				thread_s->servId = servId_copy;
				thread_s->headers = headers;
				thread_s->propertySet = propertySet;
				strncpy(thread_s->sid,
					finger->sid,
					sizeof thread_s->sid);
				thread_s->sid[sizeof thread_s->sid - 1] = 0;
				thread_s->ctime = time(0);
				thread_s->device_handle = device_handle;

				maybeDiscardEvents(&finger->outgoing);
				job = (ThreadPoolJob *)malloc(
					sizeof(ThreadPoolJob));
				if (!job) {
					free(thread_s);
					line = __LINE__;
					ret = UPNP_E_OUTOF_MEMORY;
					break;
				}
				memset(job, 0, sizeof(ThreadPoolJob));
				TPJobInit(job,
					(start_routine)genaNotifyThread,
					thread_s);
				TPJobSetFreeFunction(
					job, (free_routine)free_notify_struct);
				TPJobSetPriority(job, MED_PRIORITY);
				node = ListAddTail(&finger->outgoing, job);

				/* If there is only one element on the list
				   (which we just
				   added), need to kickstart the threadpool */
				if (ListSize(&finger->outgoing) == 1) {
					ret = ThreadPoolAdd(
						&gSendThreadPool, job, NULL);
					if (ret != 0) {
						line = __LINE__;
						if (ret == EOUTOFMEM) {
							line = __LINE__;
							ret = UPNP_E_OUTOF_MEMORY;
						}
						break;
					}
					if (node) {
						((ThreadPoolJob *)(node->item))
							->jobId = STALE_JOBID;
					}
				}
				finger = GetNextSubscription(service, finger);
			}
		} else {
			line = __LINE__;
			ret = GENA_E_BAD_SERVICE;
		}
	}

ExitFunction:
	/* The only case where we want to free memory here is if the
	   struct was never queued. Else, let the normal cleanup take place.
	   reference_count is allocated first so it's ok to do nothing if it's 0
	*/
	if (reference_count && *reference_count == 0) {
		free(headers);
		ixmlFreeDOMString(propertySet);
		free(servId_copy);
		free(UDN_copy);
		free(reference_count);
	}

	HandleUnlock(__FILE__, __LINE__);

	UpnpPrintf(UPNP_INFO,
		GENA,
		__FILE__,
		line,
		"GENA END NOTIFY ALL COMMON, ret = %d\n",
		ret);

	return ret;
}